

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void __thiscall CompilerContext::compile_switch(CompilerContext *this,SyntaxTree *switch_node)

{
  element_type *peVar1;
  SyntaxTree *this_00;
  OptionalBase<unsigned_int> OVar2;
  Command *pCVar3;
  Command *pCVar4;
  element_type *peVar5;
  pointer this_01;
  CompilerContext *pCVar6;
  SwitchAnnotation *pSVar7;
  pointer psVar8;
  SwitchCaseAnnotation *__args_1;
  iterator e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  long lVar10;
  LoopInfo *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> cases;
  int value;
  shared_ptr<Label> break_ptr;
  LoopInfo local_a8;
  int local_7c;
  undefined1 local_78 [32];
  pointer local_58;
  shared_ptr<Label> local_50;
  pointer local_40;
  CompilerContext *local_38;
  
  make_internal_label((CompilerContext *)local_78);
  local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.break_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78._0_8_;
  local_a8.break_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
    }
  }
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::
  emplace_back<CompilerContext::LoopInfo>(&this->loop_stack,&local_a8);
  if (local_a8.break_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.break_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.break_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_40 = (pointer)&this->loop_stack;
  local_38 = this;
  pSVar7 = SyntaxTree::annotation<SwitchAnnotation_const&>(switch_node);
  std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::reserve
            ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&local_a8,
             pSVar7->num_cases + 1);
  peVar1 = (switch_node->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar8 = *(pointer *)
            &(peVar1->childs).
             super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
  ;
  peVar5 = local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var11._M_pi = local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  _Var9._M_pi = local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_78._16_8_ = switch_node;
  if (*(pointer *)((long)&peVar1->childs + 8) != psVar8) {
    lVar10 = 0;
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      this_00 = *(SyntaxTree **)
                 ((long)&psVar8->super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> + lVar10
                 );
      if (this_00->type_ == CASE) {
        local_7c = SyntaxTree::annotation<int>
                             ((((this_00->childs).
                                super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        __args_1 = SyntaxTree::annotation<SwitchCaseAnnotation_const&>(this_00);
        std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>::
        emplace_back<int&,Command_const*const&>
                  ((vector<CompilerContext::Case,std::allocator<CompilerContext::Case>> *)&local_a8,
                   &local_7c,&__args_1->is_var_eq_int);
      }
      else if (this_00->type_ == DEFAULT) {
        std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>::
        emplace_back<std::experimental::nullopt_t_const&,std::experimental::nullopt_t_const&>
                  ((vector<CompilerContext::Case,std::allocator<CompilerContext::Case>> *)&local_a8,
                   (nullopt_t *)&nullopt,(nullopt_t *)&nullopt);
      }
      else if (local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               != (element_type *)
                  local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[-1]._vptr__Sp_counted_base ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
          local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[-1]._vptr__Sp_counted_base = (_func_int **)p_Var14;
        }
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         &local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[-1]._M_use_count = p_Var14;
      }
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var14->_vptr__Sp_counted_base + 1);
      psVar8 = *(pointer *)
                &(peVar1->childs).
                 super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
      ;
      lVar10 = lVar10 + 0x10;
      peVar5 = local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var11._M_pi = local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      _Var9._M_pi = local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    } while (p_Var14 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)*(pointer *)((long)&peVar1->childs + 8) - (long)psVar8 >> 4));
  }
  for (; pCVar6 = local_38, this_01 = local_40,
      peVar5 != (element_type *)
                local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi; peVar5 = peVar5 + 1) {
    p_Var14 = (peVar5->where).super___weak_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    _Var13._M_pi = _Var9._M_pi;
    if (p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
      _Var12._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar5 + 1);
      if (_Var9._M_pi ==
          local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi) {
        _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
      }
    }
    else {
      _Var12._M_pi = _Var11._M_pi;
      if ((_Var9._M_pi !=
           local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi) &&
         (_Var12._M_pi = local_a8.continue_label.
                         super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
         _Var13._M_pi = local_a8.continue_label.
                        super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
         _Var9._M_pi != _Var11._M_pi)) {
        OVar2 = (peVar5->code_position).super_OptionalBase<unsigned_int>;
        do {
          (((element_type *)_Var9._M_pi)->where).
          super___weak_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var14
          ;
          (((element_type *)_Var9._M_pi)->code_position).super_OptionalBase<unsigned_int> = OVar2;
          _Var9._M_pi = _Var9._M_pi + 0x38;
        } while (_Var9._M_pi != _Var11._M_pi);
      }
    }
    _Var11._M_pi = _Var12._M_pi;
    _Var9._M_pi = _Var13._M_pi;
  }
  pCVar3 = ((*(Commands **)((long)local_38 + 0x58))->switch_start).ref;
  if (((pCVar3 == (Command *)0x0) ||
      (pCVar4 = ((*(Commands **)((long)local_38 + 0x58))->switch_continued).ref,
      (pCVar4 != (Command *)0x0 & pCVar3->supported) != 1)) || (pCVar4->supported != true)) {
    local_78._24_8_ = local_78._0_8_;
    local_58 = (pointer)local_78._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
      }
    }
    compile_switch_ifchain
              (local_38,(SyntaxTree *)local_78._16_8_,
               (vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&local_a8,
               (shared_ptr<Label> *)(local_78 + 0x18));
    _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58;
  }
  else {
    local_50.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_78._0_8_;
    local_50.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
      }
    }
    compile_switch_withop
              (local_38,(SyntaxTree *)local_78._16_8_,
               (vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&local_a8,
               &local_50);
    _Var11._M_pi = local_50.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  if ((pointer)_Var11._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi);
  }
  __p = *(pointer *)
         &((vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_> *)
          ((long)pCVar6 + 0x30))->
          super__Vector_base<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>
        + -1;
  *(LoopInfo **)
   &((vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_> *)
    ((long)pCVar6 + 0x30))->
    super__Vector_base<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_> = __p;
  __gnu_cxx::new_allocator<CompilerContext::LoopInfo>::destroy<CompilerContext::LoopInfo>
            ((new_allocator<CompilerContext::LoopInfo> *)this_01,__p);
  std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::~vector
            ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&local_a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  return;
}

Assistant:

void CompilerContext::compile_switch(const SyntaxTree& switch_node)
{
    auto continue_ptr = nullptr;
    auto break_ptr = make_internal_label();

    loop_stack.emplace_back(LoopInfo{ continue_ptr, break_ptr });

    std::vector<Case> cases;
    cases.reserve(1 + switch_node.annotation<const SwitchAnnotation&>().num_cases);

    auto& switch_body = switch_node.child(1);
    for(size_t i = 0; i < switch_body.child_count(); ++i)
    {
        auto& node = switch_body.child(i);
        switch(node.type())
        {
            case NodeType::CASE:
            {
                auto value  = node.child(0).annotation<int32_t>();
                auto& isveq = node.annotation<const SwitchCaseAnnotation&>().is_var_eq_int;
                cases.emplace_back(value, isveq);
                break;
            }

            case NodeType::DEFAULT:
            {
                cases.emplace_back(nullopt, nullopt);
                break;
            }

            default: // statement
            {
                if(!cases.empty())
                {
                    auto& prev_case = cases.back();
                    if(prev_case.first_statement_id == SIZE_MAX)
                        prev_case.first_statement_id = i;
                    prev_case.last_statement_id = i;
                }
                break;
            }
        }
    }

    auto blank_cases_begin = cases.end();
    auto blank_cases_end   = cases.end();

    for(auto it = cases.begin(); it != cases.end(); ++it)
    {
        if(it->is_empty())
        {
            if(blank_cases_begin == cases.end())
            {
                blank_cases_begin = it;
                blank_cases_end   = std::next(it);
            }
            else
            {
                blank_cases_end = std::next(it);
            }
        }
        else
        {
            if(blank_cases_begin != cases.end())
            {
                for(auto e = blank_cases_begin; e != blank_cases_end; ++e)
                {
                    e->first_statement_id = it->first_statement_id;
                    e->last_statement_id  = it->last_statement_id;
                }

                blank_cases_begin = cases.end();
                blank_cases_end = cases.end();
            }
        }
    }

    auto opt_switch_start = commands.switch_start;
    auto opt_switch_continued = commands.switch_continued;

    if(opt_switch_start && opt_switch_start->supported
    && opt_switch_continued && opt_switch_continued->supported)
    {
        compile_switch_withop(switch_node, cases, break_ptr);
    }
    else
    {
        compile_switch_ifchain(switch_node, cases, break_ptr);
    }

    loop_stack.pop_back();
}